

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

int __thiscall Assimp::ColladaParser::TestAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  undefined4 extraout_var;
  uint local_24;
  int a;
  char *pAttr_local;
  ColladaParser *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[4])();
    if (iVar1 <= (int)local_24) {
      return -1;
    }
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_24);
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),pAttr);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int ColladaParser::TestAttribute(const char* pAttr) const
{
    for (int a = 0; a < mReader->getAttributeCount(); a++)
        if (strcmp(mReader->getAttributeName(a), pAttr) == 0)
            return a;

    return -1;
}